

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecSimulationDataGenerator.cpp
# Opt level: O3

U32 __thiscall
HdmiCecSimulationDataGenerator::GenerateSimulationData
          (HdmiCecSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channel)

{
  int iVar1;
  ErrorType EVar2;
  ulong uVar3;
  ulong uVar4;
  ErrorType EVar5;
  
  uVar3 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  while( true ) {
    uVar4 = SimulationChannelDescriptor::GetCurrentSampleNumber();
    if (uVar3 <= uVar4) break;
    EVar5 = ERR_NOERROR;
    EVar2 = ERR_NOERROR;
    if (this->mSimulateErrors == true) {
      iVar1 = rand();
      EVar2 = iVar1 % 5;
    }
    this->mErrorType = EVar2;
    GenVersionTransaction(this);
    AdvanceRand(this,5.0,15.0);
    if (this->mSimulateErrors == true) {
      iVar1 = rand();
      EVar5 = iVar1 % 5;
    }
    this->mErrorType = EVar5;
    GetStandbyTransaction(this);
    AdvanceRand(this,5.0,15.0);
    EVar2 = ERR_NOERROR;
    if (this->mSimulateErrors == true) {
      iVar1 = rand();
      EVar2 = iVar1 % 5;
    }
    this->mErrorType = EVar2;
    GetInitTransaction(this);
    AdvanceRand(this,5.0,15.0);
  }
  *simulation_channel = &this->mCecSimulationData;
  return 1;
}

Assistant:

U32 HdmiCecSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                            SimulationChannelDescriptor** simulation_channel )
{
    const U64 lastSample = AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mCecSimulationData.GetCurrentSampleNumber() < lastSample )
    {
        SetRandomErrorType();
        GenVersionTransaction();
        AdvanceRand( 5.0f, 15.0f );

        SetRandomErrorType();
        GetStandbyTransaction();
        AdvanceRand( 5.0f, 15.0f );

        SetRandomErrorType();
        GetInitTransaction();
        AdvanceRand( 5.0f, 15.0f );
    }

    *simulation_channel = &mCecSimulationData;
    return 1; // We are simulating one channel
}